

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilFile.c
# Opt level: O3

char * Extra_FileDesignName(char *pFileName)

{
  byte bVar1;
  byte *pbVar2;
  byte *pbVar3;
  byte *pbVar4;
  byte *pbVar5;
  char *pcVar6;
  
  pcVar6 = pFileName + 1;
  for (pbVar5 = (byte *)pFileName; (*pbVar5 != 0 && (*pbVar5 != 0x2e)); pbVar5 = pbVar5 + 1) {
    pcVar6 = pcVar6 + 1;
  }
  pbVar3 = pbVar5 + -1;
  pbVar4 = pbVar5;
  if (pFileName <= pbVar3) {
    do {
      bVar1 = *pbVar3;
      if ((0x19 < (byte)((bVar1 & 0xdf) + 0xbf)) && (bVar1 != 0x5f && 9 < (byte)(bVar1 - 0x30)))
      break;
      pbVar3 = pbVar3 + -1;
    } while (pFileName <= pbVar3);
    pbVar4 = pbVar3 + 1;
  }
  pbVar2 = (byte *)malloc((long)pcVar6 - (long)pbVar4);
  pbVar3 = pbVar2;
  for (; pbVar4 < pbVar5; pbVar4 = pbVar4 + 1) {
    *pbVar3 = *pbVar4;
    pbVar3 = pbVar3 + 1;
  }
  *pbVar3 = 0;
  return (char *)pbVar2;
}

Assistant:

char * Extra_FileDesignName( char * pFileName )
{
    char * pBeg, * pEnd, * pStore, * pCur;
    // find the first dot
    for ( pEnd = pFileName; *pEnd; pEnd++ )
        if ( *pEnd == '.' )
            break;
    // find the first char
    for ( pBeg = pEnd - 1; pBeg >= pFileName; pBeg-- )
        if ( !((*pBeg >= 'a' && *pBeg <= 'z') || (*pBeg >= 'A' && *pBeg <= 'Z') || (*pBeg >= '0' && *pBeg <= '9') || *pBeg == '_') )
            break;
    pBeg++;
    // fill up storage
    pStore = ABC_ALLOC( char, pEnd - pBeg + 1 );
    for ( pCur = pStore; pBeg < pEnd; pBeg++, pCur++ )
        *pCur = *pBeg;
    *pCur = 0;
    return pStore;
}